

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriHelper.cpp
# Opt level: O0

Var Js::UriHelper::Encode
              (JavascriptString *strURI,uchar unescapedFlags,ScriptContext *scriptContext)

{
  byte bVar1;
  char16 c_00;
  char16 cVar2;
  code *pcVar3;
  bool bVar4;
  charcount_t cVar5;
  BOOL BVar6;
  uint32 uVar7;
  ScriptContext *pSVar8;
  undefined4 *puVar9;
  Recycler *pRVar10;
  char16_t *pcVar11;
  uint local_c8;
  BYTE val;
  uint32 j;
  uint32 utfLen_1;
  char16 c1_1;
  uint32 uVal_1;
  char16 c_1;
  uint32 k_1;
  char16 *hexStream;
  char16 *outCurrent;
  TrackAllocData local_90;
  char16_t *local_68;
  char16 *outURI;
  uint32 local_58;
  uint32 allocSize;
  uint32 utfLen;
  char16 c1;
  uint32 uVal;
  uint32 uStack_44;
  char16 c;
  uint32 k;
  uint32 outputLen;
  BYTE bUTF8 [4];
  char16 *pcStack_38;
  bool needsChanges;
  char16 *input;
  charcount_t len;
  ScriptContext *scriptContext_local;
  uchar unescapedFlags_local;
  JavascriptString *strURI_local;
  
  cVar5 = JavascriptString::GetLength(strURI);
  pcStack_38 = JavascriptString::GetString(strURI);
  outputLen._3_1_ = 0;
  uStack_44 = 0;
  uVal = 0;
  do {
    if (cVar5 <= uVal) {
      if ((outputLen._3_1_ & 1) == 0) {
        pSVar8 = RecyclableObject::GetScriptContext(&strURI->super_RecyclableObject);
        strURI_local = strURI;
        if (scriptContext != pSVar8) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/UriHelper.cpp"
                                      ,0xb8,"(scriptContext == strURI->GetScriptContext())",
                                      "Should have already marshaled the string in cross site thunk"
                                     );
          if (!bVar4) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
      }
      else {
        outURI._4_4_ = UInt32Math::Add(uStack_44,1);
        pRVar10 = ScriptContext::GetRecycler(scriptContext);
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_90,(type_info *)&char16_t::typeinfo,0,(ulong)outURI._4_4_,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/UriHelper.cpp"
                   ,0xbf);
        pRVar10 = Memory::Recycler::TrackAllocInfo(pRVar10,&local_90);
        hexStream = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                              ((Memory *)pRVar10,(Recycler *)Memory::Recycler::AllocLeaf,0,
                               (ulong)outURI._4_4_);
        local_68 = hexStream;
        for (uVal_1 = 0; uVal_1 < cVar5; uVal_1 = uVal_1 + 1) {
          c_00 = pcStack_38[uVal_1];
          BVar6 = InURISet(c_00,unescapedFlags);
          if (BVar6 == 0) {
            if ((0xdbff < (ushort)c_00) && ((ushort)c_00 < 0xe000)) {
              JavascriptError::ThrowURIError(scriptContext,-0x7ff5ffcd,(PCWSTR)0x0);
            }
            if (((ushort)c_00 < 0xd800) || (0xdbff < (ushort)c_00)) {
              utfLen_1 = (uint32)(ushort)c_00;
            }
            else {
              uVal_1 = uVal_1 + 1;
              if (uVal_1 == cVar5) {
                JavascriptError::ThrowURIError(scriptContext,-0x7ff5ffcd,(PCWSTR)0x0);
              }
              cVar2 = pcStack_38[uVal_1];
              if (((ushort)cVar2 < 0xdc00) || (0xdfff < (ushort)cVar2)) {
                JavascriptError::ThrowURIError(scriptContext,-0x7ff5ffcd,(PCWSTR)0x0);
              }
              utfLen_1 = ((ushort)c_00 - 0xd800) * 0x400 + (uint)(ushort)cVar2 + 0x2400;
            }
            uVar7 = ToUTF8(utfLen_1,(BYTE *)((long)&k + 3));
            for (local_c8 = 0; local_c8 < uVar7; local_c8 = local_c8 + 1) {
              bVar1 = *(byte *)((long)&k + (ulong)local_c8 + 3);
              *hexStream = L'%';
              pcVar11 = hexStream + 2;
              hexStream[1] = L"0123456789ABCDEF"[(int)(uint)bVar1 >> 4];
              hexStream = hexStream + 3;
              *pcVar11 = L"0123456789ABCDEF"[(int)(bVar1 & 0xf)];
            }
          }
          else {
            *hexStream = c_00;
            hexStream = hexStream + 1;
          }
        }
        if (local_68 + uStack_44 != hexStream) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/UriHelper.cpp"
                                      ,0xf9,"(outURI + outputLen == outCurrent)",
                                      " URI out buffer out of sync");
          if (!bVar4) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
        local_68[uStack_44] = L'\0';
        strURI_local = JavascriptString::NewWithBuffer(local_68,uStack_44,scriptContext);
      }
      return strURI_local;
    }
    c1 = pcStack_38[uVal];
    BVar6 = InURISet(c1,unescapedFlags);
    if (BVar6 == 0) {
      outputLen._3_1_ = 1;
      if ((0xdbff < (ushort)c1) && ((ushort)c1 < 0xe000)) {
        JavascriptError::ThrowURIError(scriptContext,-0x7ff5ec60,(PCWSTR)0x0);
      }
      if (((ushort)c1 < 0xd800) || (0xdbff < (ushort)c1)) {
        utfLen = (uint32)(ushort)c1;
      }
      else {
        uVal = uVal + 1;
        if (uVal == cVar5) {
          JavascriptError::ThrowURIError(scriptContext,-0x7ff5ec60,(PCWSTR)0x0);
        }
        allocSize._2_2_ = pcStack_38[uVal];
        if (((ushort)allocSize._2_2_ < 0xdc00) || (0xdfff < (ushort)allocSize._2_2_)) {
          JavascriptError::ThrowURIError(scriptContext,-0x7ff5ec60,(PCWSTR)0x0);
        }
        utfLen = ((ushort)c1 - 0xd800) * 0x400 + (uint)(ushort)allocSize._2_2_ + 0x2400;
      }
      local_58 = ToUTF8(utfLen,(BYTE *)((long)&k + 3));
      local_58 = UInt32Math::Mul(local_58,3);
      uStack_44 = UInt32Math::Add(uStack_44,local_58);
    }
    else {
      uStack_44 = UInt32Math::Add(uStack_44,1);
    }
    uVal = uVal + 1;
  } while( true );
}

Assistant:

Var UriHelper::Encode(JavascriptString* strURI, unsigned char unescapedFlags, ScriptContext* scriptContext )
    {
        charcount_t len = strURI->GetLength();
        __in_ecount(len) const char16* input = strURI->GetString();
        bool needsChanges = false;
        BYTE bUTF8[MaxUTF8Len];

        // pass 1 calculate output length and error check
        uint32 outputLen = 0;
        for( uint32 k = 0; k < len; k++ )
        {
            char16 c = input[k];
            uint32 uVal;
            if( InURISet(c, unescapedFlags) )
            {
                outputLen = UInt32Math::Add(outputLen, 1);
            }
            else
            {
                needsChanges = true;

                if( c >= 0xDC00 && c <= 0xDFFF )
                {
                    JavascriptError::ThrowURIError(scriptContext, JSERR_URIEncodeError /* TODO-ERROR: _u("NEED MESSAGE") */);
                }
                else if( c < 0xD800 || c > 0xDBFF )
                {
                    uVal = (uint32)c;
                }
                else
                {
                    ++k;
                    if(k == len)
                    {
                        JavascriptError::ThrowURIError(scriptContext, JSERR_URIEncodeError /* TODO-ERROR: _u("NEED MESSAGE") */);
                    }
                    __analysis_assume(k < len); // because we throw exception if k==len
                    char16 c1 = input[k];
                    if( c1 < 0xDC00 || c1 > 0xDFFF )
                    {
                        JavascriptError::ThrowURIError(scriptContext, JSERR_URIEncodeError /* TODO-ERROR: _u("NEED MESSAGE") */);
                    }
                    uVal = (c - 0xD800) * 0x400 + (c1 - 0xDC00) + 0x10000;
                }
                uint32 utfLen = ToUTF8(uVal, bUTF8);
                utfLen = UInt32Math::Mul(utfLen, 3);
                outputLen = UInt32Math::Add(outputLen, utfLen);
            }
        }

        // If nothing needs encoding, then avoid extra work
        if (!needsChanges)
        {
            AssertMsg(scriptContext == strURI->GetScriptContext(), "Should have already marshaled the string in cross site thunk");
            return strURI;
        }

        //pass 2 generate the encoded URI

        uint32 allocSize = UInt32Math::Add(outputLen, 1);
        char16* outURI = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, allocSize);
        char16* outCurrent = outURI;
        const char16 *hexStream = _u("0123456789ABCDEF");

        for( uint32 k = 0; k < len; k++ )
        {
            char16 c = input[k];
            uint32 uVal;
            if( InURISet(c, unescapedFlags) )
            {
                __analysis_assume(outCurrent < outURI + allocSize);
                *outCurrent++ = c;
            }
            else
            {
#if DBG
                if( c >= 0xDC00 && c <= 0xDFFF )
                {
                    JavascriptError::ThrowURIError(scriptContext, VBSERR_InternalError /* TODO-ERROR: _u("NEED MESSAGE") */);
                }
#endif
                if( c < 0xD800 || c > 0xDBFF )
                {
                    uVal = (uint32)c;
                }
                else
                {
                    ++k;
#if DBG
                    if(k == len)
                    {
                        JavascriptError::ThrowURIError(scriptContext, VBSERR_InternalError /* TODO-ERROR: _u("NEED MESSAGE") */);
                    }
#endif
                    __analysis_assume(k < len);// because we throw exception if k==len
                    char16 c1 = input[k];

#if DBG
                    if( c1 < 0xDC00 || c1 > 0xDFFF )
                    {
                        JavascriptError::ThrowURIError(scriptContext, VBSERR_InternalError /* TODO-ERROR: _u("NEED MESSAGE") */);
                    }
#endif
                    uVal = (c - 0xD800) * 0x400 + (c1 - 0xDC00) + 0x10000;
                }

                uint32 utfLen = ToUTF8(uVal, bUTF8);
                for( uint32 j = 0; j < utfLen; j++ )
                {
#pragma prefast(disable: 26014, "buffer length was calculated earlier");
                    BYTE val = bUTF8[j];
                    *outCurrent++ = _u('%');
                    *outCurrent++ = hexStream[(val >> 4)];
                    *outCurrent++ = hexStream[(val & 0xF)];
#pragma prefast(default: 26014);
                }
            }
        }
        AssertMsg(outURI + outputLen == outCurrent, " URI out buffer out of sync");
        __analysis_assume(outputLen + 1 == allocSize);
        outURI[outputLen] = _u('\0');

        return JavascriptString::NewWithBuffer(outURI, outputLen, scriptContext);
    }